

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

FileName * __thiscall embree::FileName::operator-(FileName *this,FileName *base)

{
  long lVar1;
  string *in_RSI;
  FileName *in_RDI;
  size_t pos;
  FileName *in_stack_ffffffffffffff68;
  FileName *this_00;
  string local_60 [24];
  string *in_stack_ffffffffffffffb8;
  FileName *in_stack_ffffffffffffffc0;
  
  this_00 = in_RDI;
  operator_cast_to_string(in_stack_ffffffffffffff68);
  lVar1 = std::__cxx11::string::find_first_of(in_RSI,(ulong)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  if (lVar1 == -1) {
    FileName(this_00,in_stack_ffffffffffffff68);
  }
  else {
    std::__cxx11::string::substr((ulong)local_60,(ulong)in_RSI);
    FileName(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::__cxx11::string::~string(local_60);
  }
  return in_RDI;
}

Assistant:

FileName FileName::operator -( const FileName& base ) const {
    size_t pos = filename.find_first_of(base);
    if (pos == std::string::npos) return *this;
    return FileName(filename.substr(pos+1));
  }